

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.cpp
# Opt level: O0

raw_ostream * llvm::operator<<(raw_ostream *OS,HexNumber *Value)

{
  raw_ostream *this;
  undefined1 in_CL;
  string local_38;
  HexNumber *local_18;
  HexNumber *Value_local;
  raw_ostream *OS_local;
  
  local_18 = Value;
  Value_local = (HexNumber *)OS;
  this = raw_ostream::operator<<(OS,"0x");
  to_hexString_abi_cxx11_(&local_38,(llvm *)local_18->Value,1,(bool)in_CL);
  raw_ostream::operator<<(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (raw_ostream *)Value_local;
}

Assistant:

raw_ostream &operator<<(raw_ostream &OS, const HexNumber &Value) {
  OS << "0x" << to_hexString(Value.Value);
  return OS;
}